

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O1

u_char * pcap_ether_aton(char *s)

{
  byte bVar1;
  ushort *puVar2;
  char cVar3;
  byte bVar4;
  byte *pbVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  
  pbVar5 = (byte *)malloc(6);
  pbVar7 = pbVar5;
  if (pbVar5 == (byte *)0x0) {
    return (u_char *)0x0;
  }
  do {
    bVar4 = *s;
    if ((bVar4 - 0x2d < 2) || (bVar4 == 0x3a)) {
      s = (char *)((byte *)s + 1);
    }
    else if (bVar4 == 0) {
      return pbVar5;
    }
    bVar4 = *s;
    ppuVar6 = __ctype_b_loc();
    puVar2 = *ppuVar6;
    cVar3 = ((puVar2[(char)bVar4] >> 9 & 1) == 0) * ' ' + -0x57;
    if ((puVar2[(char)bVar4] >> 0xb & 1) != 0) {
      cVar3 = -0x30;
    }
    bVar4 = cVar3 + bVar4;
    bVar1 = ((byte *)s)[1];
    if ((*(byte *)((long)puVar2 + (ulong)bVar1 * 2 + 1) & 0x10) == 0) {
      s = (char *)((byte *)s + 1);
    }
    else {
      s = (char *)((byte *)s + 2);
      cVar3 = ((puVar2[(char)bVar1] >> 9 & 1) == 0) * ' ' + -0x57;
      if ((puVar2[(char)bVar1] >> 0xb & 1) != 0) {
        cVar3 = -0x30;
      }
      bVar4 = bVar4 * '\x10' | cVar3 + bVar1;
    }
    *pbVar7 = bVar4;
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

u_char *
pcap_ether_aton(const char *s)
{
	register u_char *ep, *e;
	register u_int d;

	e = ep = (u_char *)malloc(6);
	if (e == NULL)
		return (NULL);

	while (*s) {
		if (*s == ':' || *s == '.' || *s == '-')
			s += 1;
		d = xdtoi(*s++);
		if (isxdigit((unsigned char)*s)) {
			d <<= 4;
			d |= xdtoi(*s++);
		}
		*ep++ = d;
	}

	return (e);
}